

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterBlur.cpp
# Opt level: O1

void __thiscall
Rml::FilterBlur::ExtendInkOverflow(FilterBlur *this,Element *element,Rectanglef *scissor_region)

{
  float fVar1;
  Vector2Type VVar2;
  Vector2Type VVar3;
  float fVar4;
  
  fVar4 = Element::ResolveLength(element,this->sigma_value);
  if (fVar4 <= 1.0) {
    fVar4 = 1.0;
  }
  fVar4 = fVar4 * 3.0;
  fVar1 = (scissor_region->p1).y;
  VVar2.y = (scissor_region->p0).y - fVar4;
  VVar2.x = (scissor_region->p0).x - fVar4;
  scissor_region->p0 = VVar2;
  VVar3.y = fVar4 + fVar1;
  VVar3.x = (scissor_region->p1).x + fVar4;
  scissor_region->p1 = VVar3;
  return;
}

Assistant:

void FilterBlur::ExtendInkOverflow(Element* element, Rectanglef& scissor_region) const
{
	const float sigma = element->ResolveLength(sigma_value);
	const float blur_extent = 3.0f * Math::Max(sigma, 1.f);
	scissor_region = scissor_region.Extend(blur_extent);
}